

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  u8 uVar1;
  Vdbe *p;
  ExprList *pEVar2;
  int iVar3;
  uint uVar4;
  int p1;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *zP4;
  Expr *pEVar8;
  CollSeq *zP4_00;
  byte bVar9;
  ExprList_item *pEVar10;
  int *piVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  int local_90;
  int local_7c;
  int iTab;
  byte *local_68;
  Expr *local_60;
  int local_54;
  int local_50;
  int rRhsHasNull;
  int *local_48;
  int local_3c;
  int regToFree;
  int iDummy;
  
  rRhsHasNull = 0;
  iTab = 0;
  uVar1 = pParse->okConstFactor;
  pEVar8 = pExpr->pLeft;
  iVar3 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar3 != 0) {
    return;
  }
  local_60 = pEVar8;
  zP4 = (byte *)exprINAffinity(pParse,pExpr);
  uVar4 = sqlite3ExprVectorSize(pExpr->pLeft);
  local_48 = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar4 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_0016733f;
  p = pParse->pVdbe;
  piVar13 = (int *)0x0;
  piVar11 = &rRhsHasNull;
  if (destIfFalse == destIfNull) {
    piVar11 = piVar13;
  }
  iVar3 = sqlite3FindInIndex(pParse,pExpr,3,piVar11,local_48,&iTab);
  pParse->okConstFactor = '\0';
  local_50 = exprCodeVector(pParse,local_60,&iDummy);
  pParse->okConstFactor = uVar1;
  piVar11 = (int *)0x0;
  if (0 < (int)uVar4) {
    piVar11 = (int *)(ulong)uVar4;
  }
  for (; (piVar14 = piVar11, piVar11 != piVar13 &&
         (piVar14 = piVar13, piVar13 == (int *)(ulong)(uint)local_48[(long)piVar13]));
      piVar13 = (int *)((long)piVar13 + 1)) {
  }
  local_68 = zP4;
  p1 = local_50;
  if ((uint)piVar14 != uVar4) {
    p1 = sqlite3GetTempRange(pParse,uVar4);
    iVar5 = local_50;
    for (piVar13 = (int *)0x0; piVar11 != piVar13; piVar13 = (int *)((long)piVar13 + 1)) {
      sqlite3VdbeAddOp3(p,0x50,iVar5 + (int)piVar13,local_48[(long)piVar13] + p1,0);
    }
  }
  zP4 = local_68;
  if (iVar3 == 5) {
    iVar3 = pParse->nLabel + -1;
    pParse->nLabel = iVar3;
    pEVar2 = (pExpr->x).pList;
    local_60 = (Expr *)sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    iVar5 = 0;
    if (destIfFalse != destIfNull) {
      iVar5 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(p,0x66,p1,p1,iVar5);
    }
    pEVar10 = pEVar2->a;
    for (lVar12 = 0; lVar12 < pEVar2->nExpr; lVar12 = lVar12 + 1) {
      iVar6 = sqlite3ExprCodeTemp(pParse,pEVar10->pExpr,&regToFree);
      if ((iVar5 != 0) && (iVar7 = sqlite3ExprCanBeNull(pEVar10->pExpr), iVar7 != 0)) {
        sqlite3VdbeAddOp3(p,0x66,iVar5,iVar6,iVar5);
      }
      if (regToFree != 0) {
        bVar9 = pParse->nTempReg;
        if ((ulong)bVar9 < 8) {
          pParse->nTempReg = bVar9 + 1;
          pParse->aTempReg[bVar9] = regToFree;
        }
      }
      if ((destIfFalse == destIfNull) && ((long)pEVar2->nExpr + -1 <= lVar12)) {
        sqlite3VdbeAddOp4(p,(p1 != iVar6) + 0x32 + (uint)(p1 != iVar6),p1,destIfFalse,iVar6,
                          (char *)local_60,-2);
        uVar4 = p->nOp;
        if (0 < (int)uVar4) {
          bVar9 = *local_68 | 0x10;
LAB_001675b1:
          p->aOp[(ulong)uVar4 - 1].p5 = (short)(char)bVar9;
        }
      }
      else {
        sqlite3VdbeAddOp4(p,(p1 != iVar6) + 0x33 + (uint)(p1 != iVar6),p1,iVar3,iVar6,
                          (char *)local_60,-2);
        uVar4 = p->nOp;
        if (0 < (int)uVar4) {
          bVar9 = *local_68;
          goto LAB_001675b1;
        }
      }
      pEVar10 = pEVar10 + 1;
    }
    if (iVar5 == 0) {
      sqlite3VdbeResolveLabel(p,iVar3);
      zP4 = local_68;
    }
    else {
      sqlite3VdbeAddOp2(p,0x32,iVar5,destIfNull);
      sqlite3VdbeGoto(p,destIfFalse);
      sqlite3VdbeResolveLabel(p,iVar3);
      bVar9 = pParse->nTempReg;
      zP4 = local_68;
      if ((ulong)bVar9 < 8) {
        pParse->nTempReg = bVar9 + 1;
        pParse->aTempReg[bVar9] = iVar5;
      }
    }
  }
  else {
    iVar6 = 0;
    local_7c = 0;
    iVar5 = destIfFalse;
    if (destIfFalse != destIfNull) {
      iVar5 = pParse->nLabel + -1;
      pParse->nLabel = iVar5;
      local_7c = iVar5;
    }
    for (; (int)piVar11 != iVar6; iVar6 = iVar6 + 1) {
      if (pParse->nErr != 0) goto LAB_0016733f;
      pEVar8 = sqlite3VectorFieldSubexpr(pExpr->pLeft,iVar6);
      iVar7 = sqlite3ExprCanBeNull(pEVar8);
      if (iVar7 != 0) {
        sqlite3VdbeAddOp2(p,0x32,p1 + iVar6,iVar5);
      }
    }
    if (iVar3 == 1) {
      local_90 = iTab;
      sqlite3VdbeAddOp3(p,0x1e,iTab,destIfFalse,p1);
      local_54 = sqlite3VdbeAddOp0(p,9);
    }
    else {
      sqlite3VdbeAddOp4(p,0x60,p1,uVar4,0,(char *)zP4,uVar4);
      if (destIfFalse == destIfNull) {
        sqlite3VdbeAddOp4Int(p,0x1c,iTab,destIfFalse,p1,uVar4);
        goto LAB_001678ca;
      }
      local_90 = iTab;
      local_54 = sqlite3VdbeAddOp4Int(p,0x1d,iTab,0,p1,uVar4);
    }
    if (uVar4 == 1 && rRhsHasNull != 0) {
      sqlite3VdbeAddOp2(p,0x33,rRhsHasNull,destIfFalse);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeGoto(p,destIfFalse);
    }
    if (local_7c != 0) {
      sqlite3VdbeResolveLabel(p,local_7c);
    }
    local_3c = sqlite3VdbeAddOp2(p,0x24,local_90,destIfFalse);
    local_7c = destIfFalse;
    if (1 < (int)uVar4) {
      local_7c = pParse->nLabel + -1;
      pParse->nLabel = local_7c;
    }
    for (iVar3 = 0; (int)piVar11 != iVar3; iVar3 = iVar3 + 1) {
      iVar5 = sqlite3GetTempReg(pParse);
      pEVar8 = sqlite3VectorFieldSubexpr(local_60,iVar3);
      zP4_00 = sqlite3ExprCollSeq(pParse,pEVar8);
      sqlite3VdbeAddOp3(p,0x5e,local_90,iVar3,iVar5);
      sqlite3VdbeAddOp4(p,0x34,p1 + iVar3,local_7c,iVar5,(char *)zP4_00,-2);
      if (iVar5 != 0) {
        bVar9 = pParse->nTempReg;
        if ((ulong)bVar9 < 8) {
          pParse->nTempReg = bVar9 + 1;
          pParse->aTempReg[bVar9] = iVar5;
        }
      }
      zP4 = local_68;
    }
    sqlite3VdbeAddOp2(p,9,0,destIfNull);
    if (1 < (int)uVar4) {
      sqlite3VdbeResolveLabel(p,local_7c);
      sqlite3VdbeAddOp2(p,0x27,local_90,local_3c + 1);
      sqlite3VdbeAddOp2(p,9,0,destIfFalse);
    }
    sqlite3VdbeJumpHere(p,local_54);
  }
LAB_001678ca:
  if (p1 != 0 && p1 != local_50) {
    bVar9 = pParse->nTempReg;
    if ((ulong)bVar9 < 8) {
      pParse->nTempReg = bVar9 + 1;
      pParse->aTempReg[bVar9] = p1;
    }
  }
LAB_0016733f:
  sqlite3DbFree(pParse->db,local_48);
  sqlite3DbFree(pParse->db,zP4);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */
  int iTab = 0;         /* Index to use */
  u8 okConstFactor = pParse->okConstFactor;

  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );
  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a
  ** vector, then it is stored in an array of nVector registers starting
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  **
  ** Avoid factoring the LHS of the IN(...) expression out of the loop,
  ** even if it is constant, as OP_Affinity may be used on the register
  ** by code generated below.  */
  assert( pParse->okConstFactor==okConstFactor );
  pParse->okConstFactor = 0;
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  pParse->okConstFactor = okConstFactor;
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList;
    CollSeq *pColl;
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( ExprUseXList(pExpr) );
    pList = pExpr->x.pList;
    pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        int op = rLhs!=r2 ? OP_Eq : OP_NotNull;
        sqlite3VdbeAddOp4(v, op, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_NotNull);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_NotNull);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        int op = rLhs!=r2 ? OP_Ne : OP_IsNull;
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, op, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, op==OP_Ne);
        VdbeCoverageIf(v, op==OP_IsNull);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( pParse->nErr ) goto sqlite3ExprCodeIN_oom_error;
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false.
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}